

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void CreateFunctionArgumentVariables
               (ExpressionContext *ctx,SynBase *source,FunctionData *function,
               ArrayView<ArgumentData> arguments,IntrusiveList<ExprVariableDefinition> *variables)

{
  uint uniqueId;
  long lVar1;
  TypeBase *pTVar2;
  SynBase *pSVar3;
  SynIdentifier *name;
  bool bVar4;
  uint offset;
  int iVar5;
  ulong uVar6;
  undefined4 extraout_var;
  ExprVariableDefinition *node;
  VariableHandle *pVVar7;
  undefined4 extraout_var_02;
  ArgumentData *pAVar8;
  char *pcVar9;
  long lVar10;
  InplaceStr name_00;
  VariableData *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  pcVar9 = arguments._8_8_;
  pAVar8 = arguments.data;
  if (arguments.count != 0) {
    uVar6 = (ulong)pcVar9 & 0xffffffff;
    lVar10 = 0;
    do {
      if (*(char *)(*(long *)((long)&pAVar8->type + lVar10) + 0x3c) == '\x01') {
        __assert_fail("!argument.type->isGeneric",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x226b,
                      "void CreateFunctionArgumentVariables(ExpressionContext &, SynBase *, FunctionData *, ArrayView<ArgumentData>, IntrusiveList<ExprVariableDefinition> &)"
                     );
      }
      lVar1 = *(long *)((long)&pAVar8->name + lVar10);
      name_00.end = pcVar9;
      name_00.begin = *(char **)(lVar1 + 0x48);
      bVar4 = anon_unknown.dwarf_c3752::CheckVariableConflict
                        ((anon_unknown_dwarf_c3752 *)ctx,
                         *(ExpressionContext **)((long)&pAVar8->source + lVar10),
                         *(SynBase **)(lVar1 + 0x40),name_00);
      offset = anon_unknown.dwarf_c3752::AllocateArgumentInScope
                         (ctx,source,4,*(TypeBase **)((long)&pAVar8->type + lVar10));
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
      this = (VariableData *)CONCAT44(extraout_var,iVar5);
      pTVar2 = *(TypeBase **)((long)&pAVar8->type + lVar10);
      pSVar3 = *(SynBase **)((long)&pAVar8->source + lVar10);
      name = *(SynIdentifier **)((long)&pAVar8->name + lVar10);
      uniqueId = ctx->uniqueVariableId;
      ctx->uniqueVariableId = uniqueId + 1;
      pcVar9 = (char *)0x0;
      VariableData::VariableData
                (this,ctx->allocator,pSVar3,ctx->scope,0,pTVar2,name,offset,uniqueId);
      pTVar2 = this->type;
      if (((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0x18)) &&
         (*(char *)((long)&pTVar2[3]._vptr_TypeBase + 2) == '\x01')) {
        anon_unknown.dwarf_c3752::Stop
                  (ctx,*(SynBase **)((long)&pAVar8->source + lVar10),
                   "ERROR: cannot create \'%.*s\' that implements \'finalize\' on stack",
                   (ulong)(uint)(*(int *)&(pTVar2->name).end - (int)(pTVar2->name).begin));
      }
      if (!bVar4) {
        ExpressionContext::AddVariable(ctx,this,true);
      }
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      node = (ExprVariableDefinition *)CONCAT44(extraout_var_00,iVar5);
      pSVar3 = *(SynBase **)((long)&pAVar8->source + lVar10);
      pTVar2 = ctx->typeVoid;
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pVVar7 = (VariableHandle *)CONCAT44(extraout_var_01,iVar5);
      pVVar7->source = *(SynBase **)((long)&pAVar8->name + lVar10);
      pVVar7->variable = this;
      pVVar7->next = (VariableHandle *)0x0;
      pVVar7->listed = false;
      (node->super_ExprBase).typeID = 0x1e;
      (node->super_ExprBase).source = pSVar3;
      (node->super_ExprBase).type = pTVar2;
      (node->super_ExprBase).next = (ExprBase *)0x0;
      (node->super_ExprBase).listed = false;
      (node->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a48;
      node->variable = pVVar7;
      node->initializer = (ExprBase *)0x0;
      IntrusiveList<ExprVariableDefinition>::push_back(variables,node);
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pVVar7 = (VariableHandle *)CONCAT44(extraout_var_02,iVar5);
      pVVar7->source = *(SynBase **)((long)&pAVar8->source + lVar10);
      pVVar7->variable = this;
      pVVar7->next = (VariableHandle *)0x0;
      pVVar7->listed = false;
      IntrusiveList<VariableHandle>::push_back(&function->argumentVariables,pVVar7);
      lVar10 = lVar10 + 0x30;
    } while (uVar6 * 0x30 != lVar10);
  }
  return;
}

Assistant:

void CreateFunctionArgumentVariables(ExpressionContext &ctx, SynBase *source, FunctionData *function, ArrayView<ArgumentData> arguments, IntrusiveList<ExprVariableDefinition> &variables)
{
	for(unsigned i = 0; i < arguments.size(); i++)
	{
		ArgumentData &argument = arguments[i];

		assert(!argument.type->isGeneric);

		bool conflict = CheckVariableConflict(ctx, argument.source, argument.name->name);

		unsigned offset = AllocateArgumentInScope(ctx, source, 4, argument.type);
		VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, argument.source, ctx.scope, 0, argument.type, argument.name, offset, ctx.uniqueVariableId++);

		if(TypeClass *classType = getType<TypeClass>(variable->type))
		{
			if(classType->hasFinalizer)
				Stop(ctx, argument.source, "ERROR: cannot create '%.*s' that implements 'finalize' on stack", FMT_ISTR(classType->name));
		}

		if(!conflict)
			ctx.AddVariable(variable, true);

		variables.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(argument.source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(argument.name, variable), NULL));

		function->argumentVariables.push_back(new (ctx.get<VariableHandle>()) VariableHandle(argument.source, variable));
	}
}